

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

bool __thiscall
argstest::ArgumentParser::AddCompletionReply(ArgumentParser *this,string *cur,string *choice)

{
  CompletionFlag *pCVar1;
  string *psVar2;
  bool bVar3;
  OptionType OVar4;
  ulong uVar5;
  long lVar6;
  value_type local_48;
  string *local_28;
  string *choice_local;
  string *cur_local;
  ArgumentParser *this_local;
  
  local_28 = choice;
  choice_local = cur;
  cur_local = (string *)this;
  uVar5 = std::__cxx11::string::empty();
  if (((uVar5 & 1) == 0) &&
     (lVar6 = std::__cxx11::string::find((string *)local_28,(ulong)choice_local), lVar6 != 0)) {
    this_local._7_1_ = false;
  }
  else {
    bVar3 = std::operator==(&this->completion->syntax,"bash");
    if (((bVar3) && (OVar4 = ParseOption(this,local_28,false), OVar4 == LongFlag)) &&
       (lVar6 = std::__cxx11::string::find((string *)local_28,(ulong)&this->longseparator),
       psVar2 = local_28, lVar6 != -1)) {
      pCVar1 = this->completion;
      std::__cxx11::string::find((string *)local_28,(ulong)&this->longseparator);
      std::__cxx11::string::substr((ulong)&local_48,(ulong)psVar2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&pCVar1->reply,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->completion->reply,local_28);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool AddCompletionReply(const std::string &cur, const std::string &choice)
            {
                if (cur.empty() || choice.find(cur) == 0)
                {
                    if (completion->syntax == "bash" && ParseOption(choice) == OptionType::LongFlag && choice.find(longseparator) != std::string::npos)
                    {
                        completion->reply.push_back(choice.substr(choice.find(longseparator) + 1));
                    } else
                    {
                        completion->reply.push_back(choice);
                    }
                    return true;
                }

                return false;
            }